

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thingdef_codeptr.cpp
# Opt level: O3

int AF_A_JumpIfInTargetLOS(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  VM_UBYTE VVar1;
  double dVar2;
  PClass *pPVar3;
  int iVar4;
  undefined4 extraout_var;
  uint uVar6;
  uint uVar7;
  void *val;
  char *pcVar8;
  AActor *other;
  AActor *this;
  anon_union_8_2_947301c2_for_TObjPtr<AActor>_1 *paVar9;
  bool bVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  _func_int **local_38;
  PClass *pPVar5;
  
  pPVar3 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    pcVar8 = "(paramnum) < numparam";
    goto LAB_0067b48a;
  }
  if ((param->field_0).field_3.Type != '\x03') {
LAB_0067b47a:
    pcVar8 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
LAB_0067b48a:
    __assert_fail(pcVar8,
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_codeptr.cpp"
                  ,0x11b5,
                  "int AF_A_JumpIfInTargetLOS(VMFrameStack *, VMValue *, int, VMReturn *, int)");
  }
  this = *(AActor **)&param->field_0;
  if ((param->field_0).field_1.atag == 1) {
    if (this == (AActor *)0x0) goto LAB_0067afdf;
    pPVar5 = (this->super_DThinker).super_DObject.Class;
    if (pPVar5 == (PClass *)0x0) {
      iVar4 = (**(this->super_DThinker).super_DObject._vptr_DObject)(this);
      pPVar5 = (PClass *)CONCAT44(extraout_var,iVar4);
      (this->super_DThinker).super_DObject.Class = pPVar5;
    }
    bVar10 = pPVar5 != (PClass *)0x0;
    if (pPVar5 != pPVar3 && bVar10) {
      do {
        pPVar5 = pPVar5->ParentClass;
        bVar10 = pPVar5 != (PClass *)0x0;
        if (pPVar5 == pPVar3) break;
      } while (pPVar5 != (PClass *)0x0);
    }
    if (!bVar10) {
      pcVar8 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_0067b48a;
    }
  }
  else {
    if (this != (AActor *)0x0) goto LAB_0067b47a;
LAB_0067afdf:
    this = (AActor *)0x0;
  }
  if (numparam == 1) {
    pcVar8 = "(paramnum) < numparam";
LAB_0067b4a9:
    __assert_fail(pcVar8,
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_codeptr.cpp"
                  ,0x11b6,
                  "int AF_A_JumpIfInTargetLOS(VMFrameStack *, VMValue *, int, VMReturn *, int)");
  }
  if ((param[1].field_0.field_3.Type != '\x03') ||
     (val = param[1].field_0.field_1.a, val != (void *)0x0 && param[1].field_0.field_1.atag != 7)) {
    pcVar8 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATE || param[paramnum].a == NULL)"
    ;
    goto LAB_0067b4a9;
  }
  uVar6 = 0;
  dVar13 = 0.0;
  if (numparam < 3) {
    uVar11 = 0;
    uVar12 = 0;
LAB_0067b06c:
    dVar15 = 0.0;
LAB_0067b070:
    other = (this->target).field_0.p;
    if (other == (AActor *)0x0) goto LAB_0067b121;
    if (((other->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0) {
      paVar9 = &(this->target).field_0;
LAB_0067b11a:
      paVar9->p = (AActor *)0x0;
      goto LAB_0067b121;
    }
LAB_0067b08c:
    if (((uVar6 & 0x20) == 0) || (0 < other->health)) {
      dVar14 = (double)CONCAT44(uVar12,uVar11);
      dVar2 = AActor::Distance3D(this,other,false);
      if (((dVar13 == 0.0) && (!NAN(dVar13))) || (dVar2 <= dVar13)) {
        uVar7 = uVar6 & 2;
        if (((dVar15 != 0.0) || (NAN(dVar15))) && (dVar2 < dVar15)) {
          if ((uVar6 & 0x10) != 0) {
            if (numret < 1) {
              return 0;
            }
            if (ret == (VMReturn *)0x0) {
              __assert_fail("ret != NULL",
                            "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_codeptr.cpp"
                            ,0x11e5,
                            "int AF_A_JumpIfInTargetLOS(VMFrameStack *, VMValue *, int, VMReturn *, int)"
                           );
            }
            goto LAB_0067b136;
          }
          if ((uVar6 & 4) != 0) {
            dVar14 = 0.0;
          }
          uVar7 = uVar6 & 10;
        }
        if (((dVar14 <= 0.0) || (360.0 <= dVar14)) ||
           (AActor::AngleTo((AActor *)&stack0xffffffffffffffc8,other,SUB81(this,0)),
           ABS((double)SUB84(((double)local_38 - (other->Angles).Yaw.Degrees) * 11930464.711111112 +
                             6755399441055744.0,0) * 8.381903171539307e-08) <= dVar14 * 0.5)) {
          if ((uVar7 != 0) || (bVar10 = P_CheckSight(other,this,1), bVar10)) {
            if (numret < 1) {
              return 0;
            }
            if (ret == (VMReturn *)0x0) {
              __assert_fail("ret != NULL",
                            "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_codeptr.cpp"
                            ,0x11fb,
                            "int AF_A_JumpIfInTargetLOS(VMFrameStack *, VMValue *, int, VMReturn *, int)"
                           );
            }
            goto LAB_0067b138;
          }
          if (numret < 1) {
            return 0;
          }
          if (ret == (VMReturn *)0x0) {
            __assert_fail("ret != NULL",
                          "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_codeptr.cpp"
                          ,0x11f9,
                          "int AF_A_JumpIfInTargetLOS(VMFrameStack *, VMValue *, int, VMReturn *, int)"
                         );
          }
        }
        else {
          if (numret < 1) {
            return 0;
          }
          if (ret == (VMReturn *)0x0) {
            __assert_fail("ret != NULL",
                          "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_codeptr.cpp"
                          ,0x11f4,
                          "int AF_A_JumpIfInTargetLOS(VMFrameStack *, VMValue *, int, VMReturn *, int)"
                         );
          }
        }
      }
      else {
        if (numret < 1) {
          return 0;
        }
        if (ret == (VMReturn *)0x0) {
          __assert_fail("ret != NULL",
                        "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_codeptr.cpp"
                        ,0x11dc,
                        "int AF_A_JumpIfInTargetLOS(VMFrameStack *, VMValue *, int, VMReturn *, int)"
                       );
        }
      }
    }
    else {
      if (numret < 1) {
        return 0;
      }
      if (ret == (VMReturn *)0x0) {
        __assert_fail("ret != NULL",
                      "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_codeptr.cpp"
                      ,0x11d5,
                      "int AF_A_JumpIfInTargetLOS(VMFrameStack *, VMValue *, int, VMReturn *, int)")
        ;
      }
    }
  }
  else {
    VVar1 = param[2].field_0.field_3.Type;
    if (VVar1 == '\x01') {
      uVar11 = (undefined4)*(undefined8 *)&param[2].field_0;
      uVar12 = (undefined4)((ulong)*(undefined8 *)&param[2].field_0 >> 0x20);
    }
    else {
      uVar11 = 0;
      uVar12 = 0;
      if (VVar1 != 0xff) {
        __assert_fail("param[paramnum].Type == REGT_FLOAT",
                      "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_codeptr.cpp"
                      ,0x11b7,
                      "int AF_A_JumpIfInTargetLOS(VMFrameStack *, VMValue *, int, VMReturn *, int)")
        ;
      }
    }
    if (numparam == 3) goto LAB_0067b06c;
    VVar1 = param[3].field_0.field_3.Type;
    if (VVar1 == '\0') {
      uVar6 = param[3].field_0.i;
    }
    else {
      uVar6 = 0;
      if (VVar1 != 0xff) {
        __assert_fail("param[paramnum].Type == REGT_INT",
                      "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_codeptr.cpp"
                      ,0x11b8,
                      "int AF_A_JumpIfInTargetLOS(VMFrameStack *, VMValue *, int, VMReturn *, int)")
        ;
      }
    }
    dVar15 = 0.0;
    if (4 < (uint)numparam) {
      VVar1 = param[4].field_0.field_3.Type;
      if (VVar1 == '\x01') {
        dVar13 = param[4].field_0.f;
      }
      else if (VVar1 != 0xff) {
        __assert_fail("param[paramnum].Type == REGT_FLOAT",
                      "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_codeptr.cpp"
                      ,0x11b9,
                      "int AF_A_JumpIfInTargetLOS(VMFrameStack *, VMValue *, int, VMReturn *, int)")
        ;
      }
      if (numparam != 5) {
        VVar1 = param[5].field_0.field_3.Type;
        if (VVar1 == '\x01') {
          dVar15 = param[5].field_0.f;
        }
        else if (VVar1 != 0xff) {
          __assert_fail("param[paramnum].Type == REGT_FLOAT",
                        "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_codeptr.cpp"
                        ,0x11ba,
                        "int AF_A_JumpIfInTargetLOS(VMFrameStack *, VMValue *, int, VMReturn *, int)"
                       );
        }
      }
    }
    if ((uVar6 & 0x40) == 0) {
      if ((*(byte *)((long)&(this->flags).Value + 2) & (byte)uVar6 & 1) != 0) {
        if ((((this->flags2).Value & 0x40000000) != 0) &&
           (other = (this->tracer).field_0.p, other != (AActor *)0x0)) {
          if (((other->super_DThinker).super_DObject.ObjectFlags & 0x20) == 0) goto LAB_0067b08c;
          paVar9 = &(this->tracer).field_0;
          goto LAB_0067b11a;
        }
        goto LAB_0067b121;
      }
      goto LAB_0067b070;
    }
    other = (this->master).field_0.p;
    if (other != (AActor *)0x0) {
      if (((other->super_DThinker).super_DObject.ObjectFlags & 0x20) == 0) goto LAB_0067b08c;
      paVar9 = &(this->master).field_0;
      goto LAB_0067b11a;
    }
LAB_0067b121:
    if (numret < 1) {
      return 0;
    }
    if (ret == (VMReturn *)0x0) {
      __assert_fail("ret != NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_codeptr.cpp"
                    ,0x11d0,
                    "int AF_A_JumpIfInTargetLOS(VMFrameStack *, VMValue *, int, VMReturn *, int)");
    }
  }
LAB_0067b136:
  val = (void *)0x0;
LAB_0067b138:
  VMReturn::SetPointer(ret,val,7);
  return 1;
}

Assistant:

DEFINE_ACTION_FUNCTION_PARAMS(AActor, A_JumpIfInTargetLOS)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_STATE		(jump);
	PARAM_ANGLE_OPT	(fov)			{ fov = 0.; }
	PARAM_INT_OPT	(flags)			{ flags = 0; }
	PARAM_FLOAT_OPT	(dist_max)		{ dist_max = 0; }
	PARAM_FLOAT_OPT	(dist_close)	{ dist_close = 0; }

	AActor *target;

	if (flags & JLOSF_CHECKMASTER)
	{
		target = self->master;
	}
	else if (self->flags & MF_MISSILE && (flags & JLOSF_PROJECTILE))
	{
		if (self->flags2 & MF2_SEEKERMISSILE)
			target = self->tracer;
		else
			target = NULL;
	}
	else
	{
		target = self->target;
	}

	if (target == NULL)
	{ // [KS] Let's not call P_CheckSight unnecessarily in this case.
		ACTION_RETURN_STATE(NULL);
	}

	if ((flags & JLOSF_DEADNOJUMP) && (target->health <= 0))
	{
		ACTION_RETURN_STATE(NULL);
	}

	double distance = self->Distance3D(target);

	if (dist_max && (distance > dist_max))
	{
		ACTION_RETURN_STATE(NULL);
	}

	bool doCheckSight = !(flags & JLOSF_NOSIGHT);

	if (dist_close && (distance < dist_close))
	{
		if (flags & JLOSF_CLOSENOJUMP)
		{
			ACTION_RETURN_STATE(NULL);
		}
		if (flags & JLOSF_CLOSENOFOV)
			fov = 0.;

		if (flags & JLOSF_CLOSENOSIGHT)
			doCheckSight = false;
	}

	if (fov > 0 && (fov < 360.))
	{
		DAngle an = absangle(target->AngleTo(self), target->Angles.Yaw);

		if (an > (fov / 2))
		{
			ACTION_RETURN_STATE(NULL); // [KS] Outside of FOV - return
		}
	}
	if (doCheckSight && !P_CheckSight (target, self, SF_IGNOREVISIBILITY))
	{
		ACTION_RETURN_STATE(NULL);
	}
	ACTION_RETURN_STATE(jump);
}